

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O1

char ** build_envp(JSContext *ctx,JSValue obj)

{
  JSValue this_obj;
  int iVar1;
  char **ptr;
  char *__s;
  char *__s_00;
  size_t __n;
  size_t __n_00;
  char *__dest;
  ulong uVar3;
  JSValue JVar4;
  uint32_t len;
  JSPropertyEnum *tab;
  uint local_6c;
  JSPropertyEnum *local_68;
  char **local_60;
  JSValueUnion local_58;
  JSValueUnion local_50;
  int64_t local_48;
  char *local_40;
  ulong local_38;
  JSValueUnion JVar2;
  
  local_48 = obj.tag;
  local_50 = obj.u;
  iVar1 = JS_GetOwnPropertyNames(ctx,&local_68,&local_6c,obj,0x11);
  if (iVar1 < 0) {
    ptr = (char **)0x0;
  }
  else {
    ptr = (char **)js_mallocz(ctx,(ulong)local_6c * 8 + 8);
    if (ptr == (char **)0x0) {
LAB_00115b6c:
      ptr = (char **)0x0;
    }
    else if (local_6c != 0) {
      uVar3 = 0;
      local_60 = ptr;
      do {
        this_obj.tag = local_48;
        this_obj.u.ptr = local_50.ptr;
        JVar4.tag = local_48;
        JVar4.u.ptr = local_50.ptr;
        JVar4 = JS_GetPropertyInternal(ctx,JVar4,local_68[uVar3].atom,this_obj,0);
        JVar2 = JVar4.u;
        if ((uint)JVar4.tag == 6) {
LAB_00115b3a:
          if (ptr != (char **)0x0) {
            if (local_6c != 0) {
              uVar3 = 0;
              do {
                js_free(ctx,ptr[uVar3]);
                uVar3 = uVar3 + 1;
              } while (uVar3 < local_6c);
            }
            js_free(ctx,ptr);
          }
          goto LAB_00115b6c;
        }
        __s = JS_ToCStringLen2(ctx,(size_t *)0x0,JVar4,0);
        local_58 = JVar2;
        if ((0xfffffff4 < (uint)JVar4.tag) &&
           (iVar1 = *JVar2.ptr, *(int *)JVar2.ptr = iVar1 + -1, iVar1 < 2)) {
          __JS_FreeValue(ctx,JVar4);
        }
        if (__s == (char *)0x0) goto LAB_00115b3a;
        __s_00 = JS_AtomToCString(ctx,local_68[uVar3].atom);
        if (__s_00 == (char *)0x0) {
LAB_00115b2f:
          JS_FreeCString(ctx,__s);
          goto LAB_00115b3a;
        }
        local_38 = uVar3;
        __n = strlen(__s_00);
        __n_00 = strlen(__s);
        __dest = (char *)js_malloc(ctx,__n + __n_00 + 2);
        if (__dest == (char *)0x0) {
          JS_FreeCString(ctx,__s_00);
          ptr = local_60;
          goto LAB_00115b2f;
        }
        memcpy(__dest,__s_00,__n);
        local_40 = __dest + __n;
        __dest[__n] = '=';
        memcpy(__dest + __n + 1,__s,__n_00);
        uVar3 = local_38;
        ptr = local_60;
        local_40[__n_00 + 1] = '\0';
        local_60[local_38] = __dest;
        JS_FreeCString(ctx,__s_00);
        JS_FreeCString(ctx,__s);
        uVar3 = uVar3 + 1;
      } while (uVar3 < local_6c);
    }
    if (local_6c != 0) {
      uVar3 = 0;
      do {
        JS_FreeAtom(ctx,local_68[uVar3].atom);
        uVar3 = uVar3 + 1;
      } while (uVar3 < local_6c);
    }
    js_free(ctx,local_68);
  }
  return ptr;
}

Assistant:

static char **build_envp(JSContext *ctx, JSValueConst obj)
{
    uint32_t len, i;
    JSPropertyEnum *tab;
    char **envp, *pair;
    const char *key, *str;
    JSValue val;
    size_t key_len, str_len;
    
    if (JS_GetOwnPropertyNames(ctx, &tab, &len, obj,
                               JS_GPN_STRING_MASK | JS_GPN_ENUM_ONLY) < 0)
        return NULL;
    envp = js_mallocz(ctx, sizeof(envp[0]) * ((size_t)len + 1));
    if (!envp)
        goto fail;
    for(i = 0; i < len; i++) {
        val = JS_GetProperty(ctx, obj, tab[i].atom);
        if (JS_IsException(val))
            goto fail;
        str = JS_ToCString(ctx, val);
        JS_FreeValue(ctx, val);
        if (!str)
            goto fail;
        key = JS_AtomToCString(ctx, tab[i].atom);
        if (!key) {
            JS_FreeCString(ctx, str);
            goto fail;
        }
        key_len = strlen(key);
        str_len = strlen(str);
        pair = js_malloc(ctx, key_len + str_len + 2);
        if (!pair) {
            JS_FreeCString(ctx, key);
            JS_FreeCString(ctx, str);
            goto fail;
        }
        memcpy(pair, key, key_len);
        pair[key_len] = '=';
        memcpy(pair + key_len + 1, str, str_len);
        pair[key_len + 1 + str_len] = '\0';
        envp[i] = pair;
        JS_FreeCString(ctx, key);
        JS_FreeCString(ctx, str);
    }
 done:
    for(i = 0; i < len; i++)
        JS_FreeAtom(ctx, tab[i].atom);
    js_free(ctx, tab);
    return envp;
 fail:
    if (envp) {
        for(i = 0; i < len; i++)
            js_free(ctx, envp[i]);
        js_free(ctx, envp);
        envp = NULL;
    }
    goto done;
}